

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O1

roaring_bitmap_t * roaring_from_sentinel_array(int *data,_Bool copy_on_write)

{
  roaring_bitmap_t *r;
  uint32_t *puVar1;
  uint32_t val;
  
  r = roaring_bitmap_create_with_capacity(0);
  (r->high_low_container).flags = (r->high_low_container).flags & 0xfe | copy_on_write;
  val = *data;
  if (val != 0xffffffff) {
    puVar1 = (uint32_t *)(data + 1);
    do {
      roaring_bitmap_add(r,val);
      val = *puVar1;
      puVar1 = puVar1 + 1;
    } while (val != 0xffffffff);
  }
  return r;
}

Assistant:

static roaring_bitmap_t *roaring_from_sentinel_array(int *data,
                                                     bool copy_on_write) {
    roaring_bitmap_t *ans = roaring_bitmap_create();
    roaring_bitmap_set_copy_on_write(ans, copy_on_write);

    for (; *data != -1; ++data) {
        roaring_bitmap_add(ans, *data);
    }
    return ans;
}